

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

bool __thiscall
Lib::
FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
::hasNext(FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
          *this)

{
  bool bVar1;
  long in_RDI;
  MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
  *in_stack_00000068;
  Option<Lib::VirtualIterator<Inferences::InductionContext>_> *in_stack_ffffffffffffff98;
  Option<Lib::VirtualIterator<Inferences::InductionContext>_> *in_stack_ffffffffffffffa0;
  Option<Lib::VirtualIterator<Inferences::InductionContext>_> local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  while( true ) {
    bVar1 = OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_>::isSome
                      ((OptionBase<Lib::VirtualIterator<Inferences::InductionContext>_> *)
                       (in_RDI + 0x30));
    if (!bVar1) {
      return false;
    }
    Option<Lib::VirtualIterator<Inferences::InductionContext>_>::operator->
              ((Option<Lib::VirtualIterator<Inferences::InductionContext>_> *)0x7d97a8);
    bVar1 = VirtualIterator<Inferences::InductionContext>::hasNext
                      ((VirtualIterator<Inferences::InductionContext> *)0x7d97b0);
    if (bVar1) break;
    bVar1 = MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
            ::hasNext((MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
                       *)0x7d97ca);
    if (bVar1) {
      in_stack_ffffffffffffffa0 = &local_38;
      MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>
      ::next(in_stack_00000068);
      move_if_value<Lib::VirtualIterator<Inferences::InductionContext>,_true>
                ((VirtualIterator<Inferences::InductionContext> *)in_stack_ffffffffffffff98);
      Option<Lib::VirtualIterator<Inferences::InductionContext>_>::OptionBase
                (in_stack_ffffffffffffffa0,
                 (VirtualIterator<Inferences::InductionContext> *)in_stack_ffffffffffffff98);
    }
    else {
      local_28 = 0;
      uStack_20 = 0;
      Option<Lib::VirtualIterator<Inferences::InductionContext>_>::Option
                ((Option<Lib::VirtualIterator<Inferences::InductionContext>_> *)0x7d982e);
    }
    Option<Lib::VirtualIterator<Inferences::InductionContext>_>::operator=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Option<Lib::VirtualIterator<Inferences::InductionContext>_>::~Option
              ((Option<Lib::VirtualIterator<Inferences::InductionContext>_> *)0x7d9851);
    if (bVar1) {
      VirtualIterator<Inferences::InductionContext>::~VirtualIterator
                ((VirtualIterator<Inferences::InductionContext> *)in_stack_ffffffffffffffa0);
      VirtualIterator<Inferences::InductionContext>::~VirtualIterator
                ((VirtualIterator<Inferences::InductionContext> *)in_stack_ffffffffffffffa0);
    }
  }
  return true;
}

Assistant:

bool hasNext()
  {
    while (_current.isSome()) {
      if (_current->hasNext()) {
        return true;
      } else {
        _current = _master.hasNext() 
          ? Option<Inner>(move_if_value<Inner>(_master.next())) 
          : Option<Inner>();
      }
    }
    return false;
  }